

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ostream * Catch::operator<<(ostream *os,Version *version)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (*version->branchName != '\0') {
    poVar1 = std::operator<<(os,'-');
    poVar1 = std::operator<<(poVar1,version->branchName);
    poVar1 = std::operator<<(poVar1,'.');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, Version const& version ) {
        os  << version.majorVersion << '.'
            << version.minorVersion << '.'
            << version.patchNumber;
        // branchName is never null -> 0th char is \0 if it is empty
        if (version.branchName[0]) {
            os << '-' << version.branchName
               << '.' << version.buildNumber;
        }
        return os;
    }